

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall pegmatite::Input::Input(Input *this,Input *orig)

{
  Index IVar1;
  
  this->_vptr_Input = (_func_int **)&PTR___cxa_pure_virtual_00165b00;
  std::__cxx11::string::string((string *)&this->user_name,(string *)&orig->user_name);
  this->buffer = orig->buffer;
  IVar1 = orig->buffer_end;
  this->buffer_start = orig->buffer_start;
  this->buffer_end = IVar1;
  return;
}

Assistant:

Input::Input(const Input& orig)
	: user_name(orig.user_name), buffer(orig.buffer),
	  buffer_start(orig.buffer_start), buffer_end(orig.buffer_end) {}